

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void bitset_set_lenrange(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = start >> 6;
  uVar3 = lenminusone + start >> 6;
  if (uVar5 == uVar3) {
    words[uVar5] = words[uVar5] |
                   (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) <<
                   ((byte)start & 0x3f);
    return;
  }
  uVar4 = (ulong)uVar3;
  uVar2 = words[uVar4];
  words[uVar5] = words[uVar5] | -1L << ((byte)start & 0x3f);
  for (uVar6 = (ulong)(uVar5 + 1); uVar6 < uVar4; uVar6 = uVar6 + 2) {
    puVar1 = words + uVar6;
    *(undefined4 *)puVar1 = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
  }
  words[uVar4] = uVar2 | 0xffffffffffffffffU >> (~(byte)(lenminusone + start) & 0x3f);
  return;
}

Assistant:

static inline void bitset_set_lenrange(uint64_t *words, uint32_t start,
                                       uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        words[firstword] |= ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                             << (start % 64);
        return;
    }
    uint64_t temp = words[endword];
    words[firstword] |= (~UINT64_C(0)) << (start % 64);
    for (uint32_t i = firstword + 1; i < endword; i += 2)
        words[i] = words[i + 1] = ~UINT64_C(0);
    words[endword] =
        temp | (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64);
}